

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Functional::anon_unknown_0::PointCase::testRender(PointCase *this)

{
  ostringstream *poVar1;
  TextureFormat log;
  GLContext *pGVar2;
  Surface *pSVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  RenderTarget *pRVar9;
  RenderTarget *pRVar10;
  ConstPixelBufferAccess *pCVar11;
  Vec4 *p;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  long lVar12;
  int contextNdx;
  ChannelOrder __fd;
  void *pvVar13;
  ulong uVar14;
  Surface diffMask;
  Surface refSurface;
  Surface testSurface;
  Surface *surfaces [2];
  Context *contexts [2];
  ReferenceContextLimits limits;
  ReferenceContextBuffers buffers;
  PositionColorShader program;
  GLContext glesContext;
  ReferenceContext refContext;
  Surface local_6ae0;
  Surface local_6ac8;
  Surface local_6ab0;
  string local_6a98;
  string local_6a78;
  string local_6a58;
  string local_6a38;
  string local_6a18;
  Surface *local_69f8;
  TextureFormat local_69f0;
  string local_69e8;
  string local_69c8;
  string local_69a8;
  Surface *local_6988 [2];
  GLContext *local_6978;
  ReferenceContext *local_6970;
  LogImage local_6960;
  LogImageSet local_68d0;
  LogImage local_6890;
  undefined1 local_6800 [384];
  ReferenceContextLimits local_6680;
  LogImage local_6628;
  ReferenceContextBuffers local_6598;
  ConstPixelBufferAccess local_6520;
  ConstPixelBufferAccess local_64f8;
  ConstPixelBufferAccess local_64d0;
  ShaderProgram local_64a8;
  GLContext local_6350;
  ReferenceContext local_61e0;
  
  pRVar9 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  iVar8 = 1;
  if (1 < pRVar9->m_numSamples) {
    iVar8 = pRVar9->m_numSamples;
  }
  log = (TextureFormat)
        ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_61e0.super_Context._vptr_Context = (_func_int **)0x0;
  local_61e0.super_Context.m_type.super_ApiType.m_bits = (ApiType)0xc8;
  local_61e0.super_Context._12_4_ = 200;
  sglr::GLContext::GLContext
            (&local_6350,((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx,
             (TestLog *)log,0,(IVec4 *)&local_61e0);
  local_6680.extensionStr._M_dataplus._M_p = (pointer)&local_6680.extensionStr.field_2;
  local_6680.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_6680.maxTextureImageUnits = 0x10;
  local_6680.maxTexture2DSize = 0x800;
  local_6680.maxTextureCubeSize = 0x800;
  local_6680.maxTexture2DArrayLayers = 0x100;
  local_6680.maxTexture3DSize = 0x100;
  local_6680.maxRenderbufferSize = 0x800;
  local_6680.maxVertexAttribs = 0x10;
  local_6680.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6680.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6680.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6680.extensionStr._M_string_length = 0;
  local_6680.extensionStr.field_2._M_local_buf[0] = '\0';
  pRVar9 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  pRVar10 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&local_6598,&pRVar9->m_pixelFormat,pRVar10->m_depthBits,0,200,200,iVar8);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_6800,&local_6598.m_colorbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_6800);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_6800,&local_6598.m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_6800);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_6800,&local_6598.m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_6800);
  sglr::ReferenceContext::ReferenceContext
            (&local_61e0,&local_6680,(MultisamplePixelBufferAccess *)&local_64a8,
             (MultisamplePixelBufferAccess *)&local_6960,(MultisamplePixelBufferAccess *)&local_6890
            );
  PositionColorShader::PositionColorShader((PositionColorShader *)&local_64a8);
  tcu::Surface::Surface(&local_6ab0,200,200);
  tcu::Surface::Surface(&local_6ac8,200,200);
  poVar1 = (ostringstream *)(local_6800 + 8);
  local_6988[0] = &local_6ab0;
  local_6988[1] = &local_6ac8;
  local_6978 = &local_6350;
  local_6970 = &local_61e0;
  local_6800._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Viewport: left=",0xf);
  std::ostream::operator<<(poVar1,(this->m_viewport).left);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tbottom=",8);
  std::ostream::operator<<(poVar1,(this->m_viewport).bottom);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\twidth=",7);
  std::ostream::operator<<(poVar1,(this->m_viewport).width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\theight=",8);
  std::ostream::operator<<(poVar1,(this->m_viewport).height);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6800,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_6800 + 0x78));
  poVar1 = (ostringstream *)(local_6800 + 8);
  local_6800._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering points with point size ",0x21);
  std::ostream::_M_insert<double>((double)this->m_pointSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Coordinates:",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6800,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_6800 + 0x78));
  if ((this->m_points).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_points).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    poVar1 = (ostringstream *)(local_6800 + 8);
    lVar12 = 0;
    uVar14 = 0;
    do {
      local_6800._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)((this->m_points).
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                   lVar12));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)((this->m_points).
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                   lVar12 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)((this->m_points).
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                   lVar12 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tw=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)((this->m_points).
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                   lVar12 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      (anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
                (&local_6960.m_name,
                 (_anonymous_namespace_ *)
                 ((long)((this->m_points).
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12),p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_6960.m_name._M_dataplus._M_p,
                 local_6960.m_name._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6800,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6960.m_name._M_dataplus._M_p != &local_6960.m_name.field_2) {
        operator_delete(local_6960.m_name._M_dataplus._M_p,
                        local_6960.m_name.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_6800 + 0x78));
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar14 < (ulong)((long)(this->m_points).
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_points).
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  lVar12 = 0;
  do {
    pGVar2 = (&local_6978)[lVar12];
    pSVar3 = local_6988[lVar12];
    uVar4 = (*(pGVar2->super_Context)._vptr_Context[0x75])(pGVar2,&local_64a8);
    uVar5 = (*(pGVar2->super_Context)._vptr_Context[0x59])(pGVar2,(ulong)uVar4,"a_position");
    local_69f8 = pSVar3;
    uVar6 = (*(pGVar2->super_Context)._vptr_Context[0x59])(pGVar2,(ulong)uVar4,"a_pointSize");
    uVar7 = (*(pGVar2->super_Context)._vptr_Context[0x59])(pGVar2,(ulong)uVar4,"a_color");
    (*(pGVar2->super_Context)._vptr_Context[0x2a])(0,0,0,0x3f800000,pGVar2);
    (*(pGVar2->super_Context)._vptr_Context[0x2b])(0x3f800000,pGVar2);
    (*(pGVar2->super_Context)._vptr_Context[0x2d])(pGVar2,0x4100);
    (*(pGVar2->super_Context)._vptr_Context[5])
              (pGVar2,(ulong)(uint)(this->m_viewport).left,(ulong)(uint)(this->m_viewport).bottom,
               (ulong)(uint)(this->m_viewport).width,(ulong)(uint)(this->m_viewport).height);
    (*(pGVar2->super_Context)._vptr_Context[0x76])(pGVar2,(ulong)uVar4);
    (*(pGVar2->super_Context)._vptr_Context[0x50])(pGVar2,(ulong)uVar5);
    (*(pGVar2->super_Context)._vptr_Context[0x4e])
              (pGVar2,(ulong)uVar5,4,0x1406,0,0,
               (this->m_points).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    (*(pGVar2->super_Context)._vptr_Context[0x53])(this->m_pointSize,pGVar2,(ulong)uVar6);
    (*(pGVar2->super_Context)._vptr_Context[0x56])(pGVar2,(ulong)uVar7);
    (*(pGVar2->super_Context)._vptr_Context[0x68])
              (pGVar2,0,0,
               (ulong)((long)(this->m_points).
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_points).
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4);
    (*(pGVar2->super_Context)._vptr_Context[0x51])(pGVar2,(ulong)uVar5);
    (*(pGVar2->super_Context)._vptr_Context[0x76])(pGVar2,0);
    (*(pGVar2->super_Context)._vptr_Context[0x77])(pGVar2,(ulong)uVar4);
    (*(pGVar2->super_Context)._vptr_Context[0x7a])(pGVar2);
    (*(pGVar2->super_Context)._vptr_Context[0x80])(pGVar2,local_69f8,0,0,200);
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  tcu::Surface::Surface(&local_6ae0,200,200);
  poVar1 = (ostringstream *)(local_6800 + 8);
  local_6800._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Comparing images... ",0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6800,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_6800 + 0x78));
  poVar1 = (ostringstream *)(local_6800 + 8);
  local_6800._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Deviation within radius of ",0x1b);
  std::ostream::operator<<(poVar1,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," is allowed.",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6800,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_6800 + 0x78));
  local_6960.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar13 = (void *)local_6ab0.m_pixels.m_cap;
  if ((void *)local_6ab0.m_pixels.m_cap != (void *)0x0) {
    pvVar13 = local_6ab0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_6800,(TextureFormat *)&local_6960,local_6ab0.m_width,
             local_6ab0.m_height,1,pvVar13);
  local_6890.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar13 = (void *)local_6ac8.m_pixels.m_cap;
  if ((void *)local_6ac8.m_pixels.m_cap != (void *)0x0) {
    pvVar13 = local_6ac8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_6960,(TextureFormat *)&local_6890,local_6ac8.m_width,
             local_6ac8.m_height,1,pvVar13);
  local_6628.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar13 = (void *)local_6ae0.m_pixels.m_cap;
  if ((void *)local_6ae0.m_pixels.m_cap != (void *)0x0) {
    pvVar13 = local_6ae0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_6890,(TextureFormat *)&local_6628,local_6ae0.m_width,
             local_6ae0.m_height,1,pvVar13);
  iVar8 = compareImages((TestLog *)log,(ConstPixelBufferAccess *)local_6800,
                        (ConstPixelBufferAccess *)&local_6960,(PixelBufferAccess *)&local_6890,1,
                        compareBlackNonBlackPixels);
  if (0 < iVar8) {
    local_6a18._M_dataplus._M_p = (pointer)&local_6a18.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a18,"Images","");
    local_6a38._M_dataplus._M_p = (pointer)&local_6a38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a38,"Image comparison","");
    tcu::LogImageSet::LogImageSet(&local_68d0,&local_6a18,&local_6a38);
    tcu::TestLog::startImageSet
              ((TestLog *)log,local_68d0.m_name._M_dataplus._M_p,
               local_68d0.m_description._M_dataplus._M_p);
    local_6a58._M_dataplus._M_p = (pointer)&local_6a58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a58,"TestImage","");
    local_6a78._M_dataplus._M_p = (pointer)&local_6a78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a78,"Test image","");
    local_6890.m_name._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_6ab0.m_pixels.m_cap != (void *)0x0) {
      local_6ab0.m_pixels.m_cap = (size_t)local_6ab0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_64d0,(TextureFormat *)&local_6890,local_6ab0.m_width,
               local_6ab0.m_height,1,(void *)local_6ab0.m_pixels.m_cap);
    pCVar11 = &local_64d0;
    tcu::LogImage::LogImage
              (&local_6960,&local_6a58,&local_6a78,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
    __fd = log.order;
    tcu::LogImage::write(&local_6960,__fd,__buf,(size_t)pCVar11);
    local_6a98._M_dataplus._M_p = (pointer)&local_6a98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a98,"ReferenceImage","");
    local_69a8._M_dataplus._M_p = (pointer)&local_69a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_69a8,"Reference image","");
    local_6628.m_name._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_6ac8.m_pixels.m_cap != (void *)0x0) {
      local_6ac8.m_pixels.m_cap = (size_t)local_6ac8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_64f8,(TextureFormat *)&local_6628,local_6ac8.m_width,
               local_6ac8.m_height,1,(void *)local_6ac8.m_pixels.m_cap);
    pCVar11 = &local_64f8;
    tcu::LogImage::LogImage
              (&local_6890,&local_6a98,&local_69a8,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_6890,__fd,__buf_00,(size_t)pCVar11);
    local_69c8._M_dataplus._M_p = (pointer)&local_69c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_69c8,"DifferenceMask","");
    local_69e8._M_dataplus._M_p = (pointer)&local_69e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_69e8,"Difference mask","");
    local_69f0.order = RGBA;
    local_69f0.type = UNORM_INT8;
    if ((void *)local_6ae0.m_pixels.m_cap != (void *)0x0) {
      local_6ae0.m_pixels.m_cap = (size_t)local_6ae0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_6520,&local_69f0,local_6ae0.m_width,local_6ae0.m_height,1
               ,(void *)local_6ae0.m_pixels.m_cap);
    pCVar11 = &local_6520;
    tcu::LogImage::LogImage
              (&local_6628,&local_69c8,&local_69e8,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_6628,__fd,__buf_01,(size_t)pCVar11);
    tcu::TestLog::endImageSet((TestLog *)log);
    poVar1 = (ostringstream *)(local_6800 + 8);
    local_6800._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Got ",4);
    std::ostream::operator<<(poVar1,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," faulty pixel(s).",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6800,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_6800 + 0x78));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6628.m_description._M_dataplus._M_p != &local_6628.m_description.field_2) {
      operator_delete(local_6628.m_description._M_dataplus._M_p,
                      local_6628.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6628.m_name._M_dataplus._M_p != &local_6628.m_name.field_2) {
      operator_delete(local_6628.m_name._M_dataplus._M_p,
                      local_6628.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_69e8._M_dataplus._M_p != &local_69e8.field_2) {
      operator_delete(local_69e8._M_dataplus._M_p,local_69e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_69c8._M_dataplus._M_p != &local_69c8.field_2) {
      operator_delete(local_69c8._M_dataplus._M_p,local_69c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6890.m_description._M_dataplus._M_p != &local_6890.m_description.field_2) {
      operator_delete(local_6890.m_description._M_dataplus._M_p,
                      local_6890.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6890.m_name._M_dataplus._M_p != &local_6890.m_name.field_2) {
      operator_delete(local_6890.m_name._M_dataplus._M_p,
                      local_6890.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_69a8._M_dataplus._M_p != &local_69a8.field_2) {
      operator_delete(local_69a8._M_dataplus._M_p,local_69a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a98._M_dataplus._M_p != &local_6a98.field_2) {
      operator_delete(local_6a98._M_dataplus._M_p,local_6a98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6960.m_description._M_dataplus._M_p != &local_6960.m_description.field_2) {
      operator_delete(local_6960.m_description._M_dataplus._M_p,
                      local_6960.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6960.m_name._M_dataplus._M_p != &local_6960.m_name.field_2) {
      operator_delete(local_6960.m_name._M_dataplus._M_p,
                      local_6960.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a78._M_dataplus._M_p != &local_6a78.field_2) {
      operator_delete(local_6a78._M_dataplus._M_p,local_6a78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a58._M_dataplus._M_p != &local_6a58.field_2) {
      operator_delete(local_6a58._M_dataplus._M_p,local_6a58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68d0.m_description._M_dataplus._M_p != &local_68d0.m_description.field_2) {
      operator_delete(local_68d0.m_description._M_dataplus._M_p,
                      local_68d0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68d0.m_name._M_dataplus._M_p != &local_68d0.m_name.field_2) {
      operator_delete(local_68d0.m_name._M_dataplus._M_p,
                      local_68d0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a38._M_dataplus._M_p != &local_6a38.field_2) {
      operator_delete(local_6a38._M_dataplus._M_p,local_6a38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a18._M_dataplus._M_p != &local_6a18.field_2) {
      operator_delete(local_6a18._M_dataplus._M_p,local_6a18.field_2._M_allocated_capacity + 1);
    }
    tcu::TestContext::setTestResult
              ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface(&local_6ae0);
  tcu::Surface::~Surface(&local_6ac8);
  tcu::Surface::~Surface(&local_6ab0);
  sglr::ShaderProgram::~ShaderProgram(&local_64a8);
  sglr::ReferenceContext::~ReferenceContext(&local_61e0);
  tcu::TextureLevel::~TextureLevel(&local_6598.m_stencilbuffer);
  tcu::TextureLevel::~TextureLevel(&local_6598.m_depthbuffer);
  tcu::TextureLevel::~TextureLevel(&local_6598.m_colorbuffer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6680.extensionStr._M_dataplus._M_p != &local_6680.extensionStr.field_2) {
    operator_delete(local_6680.extensionStr._M_dataplus._M_p,
                    CONCAT71(local_6680.extensionStr.field_2._M_allocated_capacity._1_7_,
                             local_6680.extensionStr.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6680.extensionList);
  sglr::GLContext::~GLContext(&local_6350);
  return;
}

Assistant:

void PointCase::testRender (void)
{
	using tcu::TestLog;

	const int numSamples			= de::max(m_context.getRenderTarget().getNumSamples(), 1);

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	PositionColorShader				program;
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	sglr::Context*					contexts[2] = {&glesContext, &refContext};
	tcu::Surface*					surfaces[2] = {&testSurface, &refSurface};

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering points with point size " << m_pointSize << ". Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_points.size(); ++ndx)
		log << TestLog::Message
				<< "\tx=" << m_points[ndx].x()
				<< "\ty=" << m_points[ndx].y()
				<< "\tz=" << m_points[ndx].z()
				<< "\tw=" << m_points[ndx].w()
				<< "\t" << genClippingPointInfoString(m_points[ndx])
				<< TestLog::EndMessage;

	for (int contextNdx = 0; contextNdx < 2; ++contextNdx)
	{
		sglr::Context&	ctx				= *contexts[contextNdx];
		tcu::Surface&	dstSurface		= *surfaces[contextNdx];
		const deUint32	programId		= ctx.createProgram(&program);
		const GLint		positionLoc		= ctx.getAttribLocation(programId, "a_position");
		const GLint		pointSizeLoc	= ctx.getAttribLocation(programId, "a_pointSize");
		const GLint		colorLoc		= ctx.getAttribLocation(programId, "a_color");

		ctx.clearColor					(0, 0, 0, 1);
		ctx.clearDepthf					(1.0f);
		ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
		ctx.useProgram					(programId);
		ctx.enableVertexAttribArray		(positionLoc);
		ctx.vertexAttribPointer			(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &m_points[0]);
		ctx.vertexAttrib1f				(pointSizeLoc, m_pointSize);
		ctx.vertexAttrib4f				(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
		ctx.drawArrays					(GL_POINTS, 0, (glw::GLsizei)m_points.size());
		ctx.disableVertexAttribArray	(positionLoc);
		ctx.useProgram					(0);
		ctx.deleteProgram				(programId);
		ctx.finish						();

		ctx.readPixels(dstSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	}

	// do the comparison
	{
		tcu::Surface		diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		const int			kernelRadius	= 1;
		int					faultyPixels;

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;

		faultyPixels = compareBlackNonBlackImages(log, testSurface.getAccess(), refSurface.getAccess(), diffMask.getAccess(), kernelRadius);

		if (faultyPixels > 0)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("ReferenceImage", "Reference image", refSurface.getAccess())
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
}